

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::~PosixWritableFile(PosixWritableFile *this)

{
  if (-1 < this->fd_) {
    Close((PosixWritableFile *)&stack0xffffffffffffffe8);
    Status::~Status((Status *)&stack0xffffffffffffffe8);
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  WritableFile::~WritableFile(&this->super_WritableFile);
  return;
}

Assistant:

~PosixWritableFile() override {
    if (fd_ >= 0) {
      // Ignoring any potential errors
      Close();
    }
  }